

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_buildsystem_t *
llb_buildsystem_create(llb_buildsystem_delegate_t delegate,llb_buildsystem_invocation_t invocation)

{
  long *plVar1;
  llb_buildsystem_t *__dest;
  OptionalStorage<llbuild::basic::QualityOfService,_true> OVar2;
  BuildSystemFrontendDelegate *this;
  FileSystem *pFVar3;
  BuildSystemFrontend *this_00;
  StringRef name;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_38;
  
  if (delegate.handle_diagnostic ==
      (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)0x0) {
    __assert_fail("delegate.handle_diagnostic",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fc,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_started == (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
    __assert_fail("delegate.command_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fd,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_finished ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)0x0) {
    __assert_fail("delegate.command_finished",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fe,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_found_discovered_dependency ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
       *)0x0) {
    __assert_fail("delegate.command_found_discovered_dependency",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4ff,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_started ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)0x0) {
    __assert_fail("delegate.command_process_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x500,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_had_error ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
       *)0x0) {
    __assert_fail("delegate.command_process_had_error",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x501,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_had_output ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
       *)0x0) {
    __assert_fail("delegate.command_process_had_output",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x502,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_finished !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
       *)0x0) {
    __dest = (llb_buildsystem_t *)operator_new(0x1f8);
    memcpy(__dest,&delegate,0xe8);
    llbuild::buildsystem::BuildSystemInvocation::BuildSystemInvocation
              ((BuildSystemInvocation *)(__dest + 0xe8));
    *(undefined8 *)(__dest + 0x1e8) = 0;
    *(undefined8 *)(__dest + 0x1f0) = 0;
    *(undefined8 *)(__dest + 0x1d8) = 0;
    *(undefined8 *)(__dest + 0x1e0) = 0;
    *(undefined8 *)(__dest + 0x1c8) = 0;
    *(undefined8 *)(__dest + 0x1d0) = 0;
    *(undefined8 *)(__dest + 0x1b8) = 0;
    *(undefined8 *)(__dest + 0x1c0) = 0;
    *(undefined8 *)(__dest + 0x1a8) = 0;
    *(undefined8 *)(__dest + 0x1b0) = 0;
    std::__cxx11::string::assign((char *)(__dest + 0x130));
    std::__cxx11::string::assign((char *)(__dest + 0xf0));
    std::__cxx11::string::assign((char *)(__dest + 0x150));
    *(char ***)(__dest + 0x180) = invocation.environment;
    *(undefined2 *)(__dest + 0xea) = invocation._32_2_;
    *(uint32_t *)(__dest + 0x174) = invocation.schedulerLanes;
    OVar2 = (OptionalStorage<llbuild::basic::QualityOfService,_true>)
            getQoSFromLLBQoS(invocation.qos);
    *(OptionalStorage<llbuild::basic::QualityOfService,_true> *)(__dest + 0x178) = OVar2;
    *(code **)(__dest + 0x1d8) =
         (anonymous_namespace)::CAPIBuildSystem::
         CAPIBuildSystem(llb_buildsystem_delegate_t_,llb_buildsystem_invocation_t_)::
         {lambda(llvm::SMDiagnostic_const&,void*)#1}::SMDiagnostic_const__void__;
    *(llb_buildsystem_t **)(__dest + 0x1e0) = __dest;
    this = (BuildSystemFrontendDelegate *)operator_new(0x120);
    name.Length = 5;
    name.Data = "basic";
    llbuild::buildsystem::BuildSystemFrontendDelegate::BuildSystemFrontendDelegate
              (this,(SourceMgr *)(__dest + 0x1a8),name,0);
    (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate =
         (_func_int **)&PTR__BuildSystemFrontendDelegate_0022bf80;
    memcpy(this + 1,&delegate,0xe8);
    plVar1 = *(long **)(__dest + 0x1e8);
    *(BuildSystemFrontendDelegate **)(__dest + 0x1e8) = this;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    pFVar3 = (FileSystem *)operator_new(0xf8);
    memcpy(pFVar3 + 1,&delegate,0xe8);
    pFVar3->_vptr_FileSystem = (_func_int **)&PTR__CAPIFileSystem_0022c078;
    llbuild::basic::createLocalFileSystem();
    this_00 = (BuildSystemFrontend *)operator_new(8);
    local_38._M_head_impl = pFVar3;
    llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
              (this_00,*(BuildSystemFrontendDelegate **)(__dest + 0x1e8),
               (BuildSystemInvocation *)(__dest + 0xe8),
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_38);
    std::
    __uniq_ptr_impl<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
    ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
             *)(__dest + 0x1f0),this_00);
    if (local_38._M_head_impl != (FileSystem *)0x0) {
      (*(local_38._M_head_impl)->_vptr_FileSystem[1])();
    }
    return __dest;
  }
  __assert_fail("delegate.command_process_finished",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x503,
                "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
               );
}

Assistant:

llb_buildsystem_t* llb_buildsystem_create(
    llb_buildsystem_delegate_t delegate,
    llb_buildsystem_invocation_t invocation) {
  // Check that all required methods are provided.
  assert(delegate.handle_diagnostic);
  assert(delegate.command_started);
  assert(delegate.command_finished);
  assert(delegate.command_found_discovered_dependency);
  assert(delegate.command_process_started);
  assert(delegate.command_process_had_error);
  assert(delegate.command_process_had_output);
  assert(delegate.command_process_finished);
         
  return (llb_buildsystem_t*) new CAPIBuildSystem(delegate, invocation);
}